

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInterval.cpp
# Opt level: O0

void anon_unknown.dwarf_5b268::testHasVolume<double>(char *type)

{
  bool bVar1;
  ostream *poVar2;
  char *in_RDI;
  Interval<double> b_2;
  double max;
  double min;
  Interval<double> b1;
  double p1;
  double p0;
  Interval<double> b0;
  Interval<double> b_1;
  Interval<double> b;
  Interval<double> *in_stack_ffffffffffffff80;
  double local_78;
  double local_70;
  Interval<double> local_68;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  Interval<double> local_38;
  Interval<double> local_28;
  Interval<double> local_18;
  char *local_8;
  
  local_8 = in_RDI;
  poVar2 = std::operator<<((ostream *)&std::cout,"    hasVolume() for type ");
  poVar2 = std::operator<<(poVar2,local_8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Interval<double>::Interval((Interval<double> *)0x1700bb);
  bVar1 = Imath_3_2::Interval<double>::hasVolume(&local_18);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.hasVolume ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x27f,"void (anonymous namespace)::testHasVolume(const char *) [T = double]");
  }
  Imath_3_2::Interval<double>::Interval((Interval<double> *)0x1700f8);
  Imath_3_2::Interval<double>::makeInfinite(in_stack_ffffffffffffff80);
  bVar1 = Imath_3_2::Interval<double>::hasVolume(&local_28);
  if (!bVar1) {
    __assert_fail("b.hasVolume ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x288,"void (anonymous namespace)::testHasVolume(const char *) [T = double]");
  }
  local_40 = -1.0;
  local_48 = 1.0;
  Imath_3_2::Interval<double>::Interval(&local_38,&local_40,&local_48);
  bVar1 = Imath_3_2::Interval<double>::hasVolume(&local_38);
  if (!bVar1) {
    __assert_fail("b0.hasVolume ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x290,"void (anonymous namespace)::testHasVolume(const char *) [T = double]");
  }
  local_50 = 2.0;
  local_58 = 4.0;
  Imath_3_2::Interval<double>::Interval(&local_68,&local_50,&local_58);
  bVar1 = Imath_3_2::Interval<double>::hasVolume(&local_68);
  if (!bVar1) {
    __assert_fail("b1.hasVolume ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x296,"void (anonymous namespace)::testHasVolume(const char *) [T = double]");
  }
  local_70 = 0.0;
  local_78 = 2.0;
  Imath_3_2::Interval<double>::Interval
            ((Interval<double> *)&stack0xffffffffffffff78,&local_70,&local_78);
  Imath_3_2::Interval<double>::makeEmpty(in_stack_ffffffffffffff80);
  bVar1 = Imath_3_2::Interval<double>::hasVolume((Interval<double> *)&stack0xffffffffffffff78);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.hasVolume ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x2a2,"void (anonymous namespace)::testHasVolume(const char *) [T = double]");
  }
  return;
}

Assistant:

void
testHasVolume (const char* type)
{
    cout << "    hasVolume() for type " << type << endl;

    //
    // Empty interval.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b;
        assert (!b.hasVolume ());
    }

    //
    // Infinite interval.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b;
        b.makeInfinite ();
        assert (b.hasVolume ());
    }

    //
    // Non-empty, has-volume interval.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b0 (T (-1), T (1));
        assert (b0.hasVolume ());

        T p0 (2);
        T p1 (4);

        IMATH_INTERNAL_NAMESPACE::Interval<T> b1 (p0, p1);
        assert (b1.hasVolume ());
    }

    //
    // Non-empty, no-volume interval.
    //
    {
        T min (0);
        T max (2);

        IMATH_INTERNAL_NAMESPACE::Interval<T> b (min, max);
        b.makeEmpty ();
        assert (!b.hasVolume ());
    }
}